

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoRightParen(ParseState *this)

{
  bool bVar1;
  RegexpOp RVar2;
  ParseFlags PVar3;
  Regexp *pRVar4;
  Regexp **ppRVar5;
  ParseState *in_RDI;
  Regexp *in_stack_00000008;
  Regexp *re;
  Regexp *r2;
  Regexp *r1;
  Regexp *in_stack_00000198;
  undefined8 in_stack_ffffffffffffffc8;
  int n;
  ParseState *this_00;
  
  n = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  DoAlternation(in_RDI);
  if (((in_RDI->stacktop_ != (Regexp *)0x0) &&
      (this_00 = (ParseState *)in_RDI->stacktop_->down_, this_00 != (ParseState *)0x0)) &&
     (RVar2 = Regexp::op((Regexp *)this_00), RVar2 == (kRegexpCharClass|kRegexpEmptyMatch))) {
    in_RDI->stacktop_ =
         *(Regexp **)((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_ + 1);
    PVar3 = parse_flags((Regexp *)this_00);
    in_RDI->flags_ = PVar3;
    if ((((anon_union_16_7_2f55f9ff_for_Regexp_10 *)&this_00->status_)->field_0).max_ < 1) {
      Decref(r1);
    }
    else {
      *(undefined1 *)&this_00->flags_ = DotNL|Literal|FoldCase;
      AllocSub((Regexp *)in_RDI,n);
      pRVar4 = FinishRegexp(this_00,(Regexp *)in_RDI);
      ppRVar5 = Regexp::sub((Regexp *)this_00);
      *ppRVar5 = pRVar4;
      bVar1 = ComputeSimple(in_stack_00000198);
      *(bool *)((long)&this_00->flags_ + 1) = bVar1;
    }
    bVar1 = PushRegexp((ParseState *)re,in_stack_00000008);
    return bVar1;
  }
  RegexpStatus::set_code(in_RDI->status_,kRegexpMissingParen);
  RegexpStatus::set_error_arg(in_RDI->status_,&in_RDI->whole_regexp_);
  return false;
}

Assistant:

bool Regexp::ParseState::DoRightParen() {
  // Finish the current concatenation and alternation.
  DoAlternation();

  // The stack should be: LeftParen regexp
  // Remove the LeftParen, leaving the regexp,
  // parenthesized.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) == NULL ||
      (r2 = r1->down_) == NULL ||
      r2->op() != kLeftParen) {
    status_->set_code(kRegexpMissingParen);
    status_->set_error_arg(whole_regexp_);
    return false;
  }

  // Pop off r1, r2.  Will Decref or reuse below.
  stacktop_ = r2->down_;

  // Restore flags from when paren opened.
  Regexp* re = r2;
  flags_ = re->parse_flags();

  // Rewrite LeftParen as capture if needed.
  if (re->cap_ > 0) {
    re->op_ = kRegexpCapture;
    // re->cap_ is already set
    re->AllocSub(1);
    re->sub()[0] = FinishRegexp(r1);
    re->simple_ = re->ComputeSimple();
  } else {
    re->Decref();
    re = r1;
  }
  return PushRegexp(re);
}